

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

bool flatbuffers::ts::TsGenerator::CanCreateFactoryMethod(StructDef *struct_def)

{
  size_type_conflict sVar1;
  const_iterator cVar2;
  bool local_2a;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_20;
  FieldDef **local_18;
  StructDef *local_10;
  StructDef *struct_def_local;
  
  local_10 = struct_def;
  sVar1 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::size
                    (&(struct_def->fields).vec);
  local_2a = true;
  if (1 < sVar1) {
    local_20._M_current =
         (FieldDef **)
         std::begin<std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>
                   (&(local_10->fields).vec);
    local_18 = (FieldDef **)
               __gnu_cxx::
               __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
               ::operator+(&local_20,1);
    cVar2 = std::end<std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>
                      (&(local_10->fields).vec);
    local_2a = std::
               all_of<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef*const*,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,flatbuffers::ts::TsGenerator::CanCreateFactoryMethod(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const*)_1_>
                         (local_18,cVar2._M_current);
  }
  return local_2a;
}

Assistant:

static bool CanCreateFactoryMethod(const StructDef &struct_def) {
    // to preserve backwards compatibility, we allow the first field to be a
    // struct
    return struct_def.fields.vec.size() < 2 ||
           std::all_of(std::begin(struct_def.fields.vec) + 1,
                       std::end(struct_def.fields.vec),
                       [](const FieldDef *f) -> bool {
                         FLATBUFFERS_ASSERT(f != nullptr);
                         return f->value.type.base_type != BASE_TYPE_STRUCT;
                       });
  }